

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

Aig_ManPre_t * Aig_ManRegManStart(Aig_Man_t *pAig,int nPartSize)

{
  int iVar1;
  Aig_ManPre_t *__s;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Flt_t *pVVar4;
  char *pcVar5;
  Aig_ManPre_t *p;
  int nPartSize_local;
  Aig_Man_t *pAig_local;
  
  __s = (Aig_ManPre_t *)malloc(0x50);
  memset(__s,0,0x50);
  __s->pAig = pAig;
  pVVar2 = Aig_ManSupportsRegisters(pAig);
  __s->vMatrix = pVVar2;
  __s->nRegsMax = nPartSize;
  pVVar2 = Vec_PtrAlloc(0x100);
  __s->vParts = pVVar2;
  pVVar3 = Vec_IntAlloc(0x100);
  __s->vRegs = pVVar3;
  pVVar3 = Vec_IntAlloc(0x100);
  __s->vUniques = pVVar3;
  pVVar3 = Vec_IntAlloc(0x100);
  __s->vFreeVars = pVVar3;
  pVVar4 = Vec_FltAlloc(0x100);
  __s->vPartCost = pVVar4;
  iVar1 = Aig_ManRegNum(__s->pAig);
  pcVar5 = (char *)malloc((long)iVar1);
  __s->pfUsedRegs = pcVar5;
  pcVar5 = __s->pfUsedRegs;
  iVar1 = Aig_ManRegNum(__s->pAig);
  memset(pcVar5,0,(long)iVar1);
  iVar1 = Aig_ManRegNum(__s->pAig);
  pcVar5 = (char *)malloc((long)iVar1);
  __s->pfPartVars = pcVar5;
  return __s;
}

Assistant:

Aig_ManPre_t * Aig_ManRegManStart( Aig_Man_t * pAig, int nPartSize )
{
    Aig_ManPre_t * p;
    p = ABC_ALLOC( Aig_ManPre_t, 1 );
    memset( p, 0, sizeof(Aig_ManPre_t) );
    p->pAig      = pAig;
    p->vMatrix   = Aig_ManSupportsRegisters( pAig );
    p->nRegsMax  = nPartSize;
    p->vParts    = Vec_PtrAlloc(256);
    p->vRegs     = Vec_IntAlloc(256);
    p->vUniques  = Vec_IntAlloc(256);
    p->vFreeVars = Vec_IntAlloc(256);
    p->vPartCost = Vec_FltAlloc(256);
    p->pfUsedRegs = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    memset( p->pfUsedRegs, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
    p->pfPartVars  = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    return p;
}